

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

int __thiscall roaring::Roaring64Map::remove(Roaring64Map *this,char *__filename)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int extraout_EAX;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  iterator iter;
  bool bVar5;
  
  p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  _Var3 = (_Rb_tree_color)((ulong)__filename >> 0x20);
  p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5]) {
    bVar5 = p_Var2[1]._M_color < _Var3;
    if (!bVar5) {
      p_Var4 = p_Var2;
    }
  }
  iter._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (iter._M_node = p_Var4, _Var3 < p_Var4[1]._M_color))
  {
    iter._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)iter._M_node != p_Var1) {
    roaring_bitmap_remove((roaring_bitmap_t *)&iter._M_node[1]._M_parent,(uint32_t)__filename);
    eraseIfEmpty(this,iter);
    return extraout_EAX;
  }
  return (int)p_Var1;
}

Assistant:

void remove(uint64_t x) {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return;
        }
        auto &bitmap = iter->second;
        bitmap.remove(lowBytes(x));
        eraseIfEmpty(iter);
    }